

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O1

void sha1_ni_write(BinarySink *bs,void *vp,size_t len)

{
  undefined1 auVar1 [16];
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var2;
  ulong __n;
  __m128i *block;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (len != 0) {
    do {
      __n = 0x40 - (long)bs[-1].write;
      if (len < __n) {
        __n = len;
      }
      memcpy(bs[-1].write + -0x58 + (long)&bs->write,vp,__n);
      p_Var2 = bs[-1].write;
      bs[-1].write = p_Var2 + __n;
      bs[-1].writefmtv = bs[-1].writefmtv + __n;
      if (p_Var2 + __n == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x40) {
        bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
        auVar4._0_8_ = bs[-5].write;
        auVar4._8_8_ = bs[-5].writefmtv;
        auVar1 = *(undefined1 (*) [16])&bs[-5].binarysink_;
        auVar3._0_8_ = bs[-4].writefmtv;
        auVar3._8_8_ = bs[-4].binarysink_;
        auVar5 = pshufb(auVar3,_DAT_00187980);
        auVar8._0_4_ = auVar1._0_4_ + auVar5._0_4_;
        auVar8._4_4_ = auVar1._4_4_ + auVar5._4_4_;
        auVar8._8_4_ = auVar1._8_4_ + auVar5._8_4_;
        auVar8._12_4_ = auVar1._12_4_ + auVar5._12_4_;
        auVar13 = sha1rnds4_sha(auVar4,auVar8,0);
        auVar7._0_8_ = bs[-3].write;
        auVar7._8_8_ = bs[-3].writefmtv;
        auVar3 = pshufb(auVar7,_DAT_00187980);
        auVar7 = sha1nexte_sha(auVar4,auVar3);
        auVar18 = sha1rnds4_sha(auVar13,auVar7,0);
        auVar7 = sha1msg1_sha(auVar5,auVar3);
        auVar8 = pshufb(*(undefined1 (*) [16])&bs[-3].binarysink_,_DAT_00187980);
        auVar5 = sha1nexte_sha(auVar13,auVar8);
        auVar19 = sha1rnds4_sha(auVar18,auVar5,0);
        auVar3 = sha1msg1_sha(auVar3,auVar8);
        auVar5._0_8_ = bs[-2].writefmtv;
        auVar5._8_8_ = bs[-2].binarysink_;
        auVar13 = pshufb(auVar5,_DAT_00187980);
        auVar5 = sha1nexte_sha(auVar18,auVar13);
        auVar7 = sha1msg2_sha(auVar7 ^ auVar8,auVar13);
        auVar20 = sha1rnds4_sha(auVar19,auVar5,0);
        auVar5 = sha1msg1_sha(auVar8,auVar13);
        auVar8 = sha1nexte_sha(auVar19,auVar7);
        auVar3 = sha1msg2_sha(auVar3 ^ auVar13,auVar7);
        auVar18 = sha1rnds4_sha(auVar20,auVar8,0);
        auVar8 = sha1msg1_sha(auVar13,auVar7);
        auVar9._0_4_ = auVar5._0_4_ ^ auVar7._0_4_;
        auVar9._4_4_ = auVar5._4_4_ ^ auVar7._4_4_;
        auVar9._8_4_ = auVar5._8_4_ ^ auVar7._8_4_;
        auVar9._12_4_ = auVar5._12_4_ ^ auVar7._12_4_;
        auVar13 = sha1nexte_sha(auVar20,auVar3);
        auVar5 = sha1msg2_sha(auVar9,auVar3);
        auVar19 = sha1rnds4_sha(auVar18,auVar13,1);
        auVar7 = sha1msg1_sha(auVar7,auVar3);
        auVar14._0_4_ = auVar8._0_4_ ^ auVar3._0_4_;
        auVar14._4_4_ = auVar8._4_4_ ^ auVar3._4_4_;
        auVar14._8_4_ = auVar8._8_4_ ^ auVar3._8_4_;
        auVar14._12_4_ = auVar8._12_4_ ^ auVar3._12_4_;
        auVar13 = sha1nexte_sha(auVar18,auVar5);
        auVar8 = sha1msg2_sha(auVar14,auVar5);
        auVar21 = sha1rnds4_sha(auVar19,auVar13,1);
        auVar3 = sha1msg1_sha(auVar3,auVar5);
        auVar20._0_4_ = auVar7._0_4_ ^ auVar5._0_4_;
        auVar20._4_4_ = auVar7._4_4_ ^ auVar5._4_4_;
        auVar20._8_4_ = auVar7._8_4_ ^ auVar5._8_4_;
        auVar20._12_4_ = auVar7._12_4_ ^ auVar5._12_4_;
        auVar13 = sha1nexte_sha(auVar19,auVar8);
        auVar7 = sha1msg2_sha(auVar20,auVar8);
        auVar18 = sha1rnds4_sha(auVar21,auVar13,1);
        auVar5 = sha1msg1_sha(auVar5,auVar8);
        auVar13._0_4_ = auVar3._0_4_ ^ auVar8._0_4_;
        auVar13._4_4_ = auVar3._4_4_ ^ auVar8._4_4_;
        auVar13._8_4_ = auVar3._8_4_ ^ auVar8._8_4_;
        auVar13._12_4_ = auVar3._12_4_ ^ auVar8._12_4_;
        auVar19 = sha1nexte_sha(auVar21,auVar7);
        auVar3 = sha1msg2_sha(auVar13,auVar7);
        auVar19 = sha1rnds4_sha(auVar18,auVar19,1);
        auVar8 = sha1msg1_sha(auVar8,auVar7);
        auVar10._0_4_ = auVar5._0_4_ ^ auVar7._0_4_;
        auVar10._4_4_ = auVar5._4_4_ ^ auVar7._4_4_;
        auVar10._8_4_ = auVar5._8_4_ ^ auVar7._8_4_;
        auVar10._12_4_ = auVar5._12_4_ ^ auVar7._12_4_;
        auVar13 = sha1nexte_sha(auVar18,auVar3);
        auVar5 = sha1msg2_sha(auVar10,auVar3);
        auVar18 = sha1rnds4_sha(auVar19,auVar13,1);
        auVar7 = sha1msg1_sha(auVar7,auVar3);
        auVar15._0_4_ = auVar8._0_4_ ^ auVar3._0_4_;
        auVar15._4_4_ = auVar8._4_4_ ^ auVar3._4_4_;
        auVar15._8_4_ = auVar8._8_4_ ^ auVar3._8_4_;
        auVar15._12_4_ = auVar8._12_4_ ^ auVar3._12_4_;
        auVar13 = sha1nexte_sha(auVar19,auVar5);
        auVar8 = sha1msg2_sha(auVar15,auVar5);
        auVar13 = sha1rnds4_sha(auVar18,auVar13,2);
        auVar3 = sha1msg1_sha(auVar3,auVar5);
        auVar21._0_4_ = auVar7._0_4_ ^ auVar5._0_4_;
        auVar21._4_4_ = auVar7._4_4_ ^ auVar5._4_4_;
        auVar21._8_4_ = auVar7._8_4_ ^ auVar5._8_4_;
        auVar21._12_4_ = auVar7._12_4_ ^ auVar5._12_4_;
        auVar18 = sha1nexte_sha(auVar18,auVar8);
        auVar7 = sha1msg2_sha(auVar21,auVar8);
        auVar19 = sha1rnds4_sha(auVar13,auVar18,2);
        auVar5 = sha1msg1_sha(auVar5,auVar8);
        auVar18._0_4_ = auVar3._0_4_ ^ auVar8._0_4_;
        auVar18._4_4_ = auVar3._4_4_ ^ auVar8._4_4_;
        auVar18._8_4_ = auVar3._8_4_ ^ auVar8._8_4_;
        auVar18._12_4_ = auVar3._12_4_ ^ auVar8._12_4_;
        auVar13 = sha1nexte_sha(auVar13,auVar7);
        auVar3 = sha1msg2_sha(auVar18,auVar7);
        auVar18 = sha1rnds4_sha(auVar19,auVar13,2);
        auVar8 = sha1msg1_sha(auVar8,auVar7);
        auVar11._0_4_ = auVar5._0_4_ ^ auVar7._0_4_;
        auVar11._4_4_ = auVar5._4_4_ ^ auVar7._4_4_;
        auVar11._8_4_ = auVar5._8_4_ ^ auVar7._8_4_;
        auVar11._12_4_ = auVar5._12_4_ ^ auVar7._12_4_;
        auVar13 = sha1nexte_sha(auVar19,auVar3);
        auVar5 = sha1msg2_sha(auVar11,auVar3);
        auVar13 = sha1rnds4_sha(auVar18,auVar13,2);
        auVar7 = sha1msg1_sha(auVar7,auVar3);
        auVar16._0_4_ = auVar8._0_4_ ^ auVar3._0_4_;
        auVar16._4_4_ = auVar8._4_4_ ^ auVar3._4_4_;
        auVar16._8_4_ = auVar8._8_4_ ^ auVar3._8_4_;
        auVar16._12_4_ = auVar8._12_4_ ^ auVar3._12_4_;
        auVar18 = sha1nexte_sha(auVar18,auVar5);
        auVar8 = sha1msg2_sha(auVar16,auVar5);
        auVar18 = sha1rnds4_sha(auVar13,auVar18,2);
        auVar3 = sha1msg1_sha(auVar3,auVar5);
        auVar6._0_4_ = auVar7._0_4_ ^ auVar5._0_4_;
        auVar6._4_4_ = auVar7._4_4_ ^ auVar5._4_4_;
        auVar6._8_4_ = auVar7._8_4_ ^ auVar5._8_4_;
        auVar6._12_4_ = auVar7._12_4_ ^ auVar5._12_4_;
        auVar13 = sha1nexte_sha(auVar13,auVar8);
        auVar7 = sha1msg2_sha(auVar6,auVar8);
        auVar20 = sha1rnds4_sha(auVar18,auVar13,3);
        auVar5 = sha1msg1_sha(auVar5,auVar8);
        auVar19._0_4_ = auVar3._0_4_ ^ auVar8._0_4_;
        auVar19._4_4_ = auVar3._4_4_ ^ auVar8._4_4_;
        auVar19._8_4_ = auVar3._8_4_ ^ auVar8._8_4_;
        auVar19._12_4_ = auVar3._12_4_ ^ auVar8._12_4_;
        auVar13 = sha1nexte_sha(auVar18,auVar7);
        auVar3 = sha1msg2_sha(auVar19,auVar7);
        auVar13 = sha1rnds4_sha(auVar20,auVar13,3);
        auVar8 = sha1msg1_sha(auVar8,auVar7);
        auVar12._0_4_ = auVar5._0_4_ ^ auVar7._0_4_;
        auVar12._4_4_ = auVar5._4_4_ ^ auVar7._4_4_;
        auVar12._8_4_ = auVar5._8_4_ ^ auVar7._8_4_;
        auVar12._12_4_ = auVar5._12_4_ ^ auVar7._12_4_;
        auVar7 = sha1nexte_sha(auVar20,auVar3);
        auVar5 = sha1msg2_sha(auVar12,auVar3);
        auVar7 = sha1rnds4_sha(auVar13,auVar7,3);
        auVar17._0_4_ = auVar8._0_4_ ^ auVar3._0_4_;
        auVar17._4_4_ = auVar8._4_4_ ^ auVar3._4_4_;
        auVar17._8_4_ = auVar8._8_4_ ^ auVar3._8_4_;
        auVar17._12_4_ = auVar8._12_4_ ^ auVar3._12_4_;
        auVar3 = sha1nexte_sha(auVar13,auVar5);
        auVar5 = sha1msg2_sha(auVar17,auVar5);
        auVar3 = sha1rnds4_sha(auVar7,auVar3,3);
        auVar7 = sha1nexte_sha(auVar7,auVar5);
        auVar7 = sha1rnds4_sha(auVar3,auVar7,3);
        *(int *)&bs[-5].write = auVar7._0_4_ + (int)auVar4._0_8_;
        *(int *)((long)&bs[-5].write + 4) = auVar7._4_4_ + (int)((ulong)auVar4._0_8_ >> 0x20);
        *(int *)&bs[-5].writefmtv = auVar7._8_4_ + (int)auVar4._8_8_;
        *(int *)((long)&bs[-5].writefmtv + 4) = auVar7._12_4_ + (int)((ulong)auVar4._8_8_ >> 0x20);
        auVar4 = sha1nexte_sha(auVar3,auVar1);
        *(undefined1 (*) [16])&bs[-5].binarysink_ = auVar4;
      }
      vp = (void *)((long)vp + __n);
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha1_ni_write(BinarySink *bs, const void *vp, size_t len)
{
    sha1_ni *s = BinarySink_DOWNCAST(bs, sha1_ni);

    while (len > 0)
        if (sha1_block_write(&s->blk, &vp, &len))
            sha1_ni_block(s->core, s->blk.block);
}